

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int32_t zng_deflateCopy(zng_stream *dest,zng_stream *source)

{
  internal_state *__src;
  deflate_state *__dest;
  uchar *puVar1;
  Pos *pPVar2;
  Pos *pPVar3;
  uchar *puVar4;
  int iVar5;
  deflate_allocs *pdVar6;
  int32_t iVar7;
  
  iVar5 = deflateStateCheck(source);
  iVar7 = -2;
  if ((dest != (zng_stream *)0x0) && (iVar5 == 0)) {
    __src = source->state;
    memcpy(dest,source,0x68);
    pdVar6 = alloc_deflate(dest,__src->w_bits,__src->lit_bufsize);
    iVar7 = -4;
    if (pdVar6 != (deflate_allocs *)0x0) {
      __dest = pdVar6->state;
      dest->state = __dest;
      memcpy(__dest,__src,0x1800);
      __dest->strm = dest;
      __dest->alloc_bufs = pdVar6;
      puVar1 = pdVar6->window;
      __dest->window = puVar1;
      pPVar2 = pdVar6->prev;
      __dest->prev = pPVar2;
      pPVar3 = pdVar6->head;
      __dest->head = pPVar3;
      puVar4 = pdVar6->pending_buf;
      __dest->pending_buf = puVar4;
      if ((pPVar2 == (Pos *)0x0 || puVar1 == (uchar *)0x0) ||
         (puVar4 == (uchar *)0x0 || pPVar3 == (Pos *)0x0)) {
        zng_deflateEnd(dest);
      }
      else {
        memcpy(puVar1,__src->window,(ulong)(__dest->w_size * 2));
        memcpy(__dest->prev,__src->prev,(ulong)__dest->w_size * 2);
        memcpy(__dest->head,__src->head,0x20000);
        memcpy(__dest->pending_buf,__src->pending_buf,(ulong)(__dest->lit_bufsize * 5));
        puVar1 = __dest->pending_buf;
        __dest->pending_out = puVar1 + ((long)__src->pending_out - (long)__src->pending_buf);
        __dest->d_buf = (uint16_t *)(puVar1 + __dest->lit_bufsize * 2);
        __dest->l_buf = puVar1 + (__dest->lit_bufsize << 2);
        (__dest->l_desc).dyn_tree = __dest->dyn_ltree;
        (__dest->d_desc).dyn_tree = __dest->dyn_dtree;
        (__dest->bl_desc).dyn_tree = __dest->bl_tree;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateCopy)(PREFIX3(stream) *dest, PREFIX3(stream) *source) {
    deflate_state *ds;
    deflate_state *ss;

    if (deflateStateCheck(source) || dest == NULL)
        return Z_STREAM_ERROR;

    ss = source->state;

    memcpy((void *)dest, (void *)source, sizeof(PREFIX3(stream)));

    deflate_allocs *alloc_bufs = alloc_deflate(dest, ss->w_bits, ss->lit_bufsize);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    ds = alloc_bufs->state;

    dest->state = (struct internal_state *) ds;
    memcpy(ds, ss, sizeof(deflate_state));
    ds->strm = dest;

    ds->alloc_bufs = alloc_bufs;
    ds->window = alloc_bufs->window;
    ds->prev = alloc_bufs->prev;
    ds->head = alloc_bufs->head;
    ds->pending_buf = alloc_bufs->pending_buf;

    if (ds->window == NULL || ds->prev == NULL || ds->head == NULL || ds->pending_buf == NULL) {
        PREFIX(deflateEnd)(dest);
        return Z_MEM_ERROR;
    }

    memcpy(ds->window, ss->window, DEFLATE_ADJUST_WINDOW_SIZE(ds->w_size * 2 * sizeof(unsigned char)));
    memcpy((void *)ds->prev, (void *)ss->prev, ds->w_size * sizeof(Pos));
    memcpy((void *)ds->head, (void *)ss->head, HASH_SIZE * sizeof(Pos));
    memcpy(ds->pending_buf, ss->pending_buf, ds->lit_bufsize * LIT_BUFS);

    ds->pending_out = ds->pending_buf + (ss->pending_out - ss->pending_buf);
#ifdef LIT_MEM
    ds->d_buf = (uint16_t *)(ds->pending_buf + (ds->lit_bufsize << 1));
    ds->l_buf = ds->pending_buf + (ds->lit_bufsize << 2);
#else
    ds->sym_buf = ds->pending_buf + ds->lit_bufsize;
#endif

    ds->l_desc.dyn_tree = ds->dyn_ltree;
    ds->d_desc.dyn_tree = ds->dyn_dtree;
    ds->bl_desc.dyn_tree = ds->bl_tree;

    return Z_OK;
}